

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall
bloaty::Bloaty::DisassembleFunction
          (Bloaty *this,string_view function,Options *options,RollupOutput *output)

{
  pointer pIVar1;
  undefined8 uVar2;
  DataSource DVar3;
  int iVar4;
  DisassemblyInfo *info_00;
  pointer pIVar5;
  string_view format;
  string_view disassembly;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> file;
  DisassemblyInfo info;
  undefined1 local_110 [40];
  string local_e8;
  undefined1 local_b8 [24];
  _Rb_tree_color local_a0;
  Rep *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Rep *local_80;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
  local_78;
  
  local_90._M_allocated_capacity = (size_type)&local_a0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_a0 = _S_red;
  local_98 = (Rep *)0x0;
  local_80 = (Rep *)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar5 = (this->input_files_).
           super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (this->input_files_).
           super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90._8_8_ = local_90._M_allocated_capacity;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  local_110._32_8_ = output;
  do {
    if (pIVar5 == pIVar1) {
      format._M_str = (char *)&local_e8;
      format._M_len = (size_t)"Couldn\'t find function $0 to disassemble";
      local_e8._M_dataplus._M_p = (pointer)function._M_len;
      local_e8._M_string_length = (size_type)function._M_str;
      absl::Substitute_abi_cxx11_((string *)local_110,(absl *)0x28,format,(Arg *)output);
      Throw((char *)local_110._0_8_,0x7ab);
    }
    GetObjectFile((Bloaty *)local_110,(string *)this);
    uVar2 = local_110._0_8_;
    DVar3 = EffectiveSymbolSource(options);
    output = (RollupOutput *)local_b8;
    iVar4 = (*(*(_func_int ***)uVar2)[4])
                      (uVar2,(pointer)function._M_len,(Rep *)function._M_str,(ulong)DVar3);
    if ((char)iVar4 == '\0') {
      if ((InputFileFactory *)local_110._0_8_ != (InputFileFactory *)0x0) {
        (*(*(_func_int ***)local_110._0_8_)[1])();
      }
    }
    else {
      DisassembleFunction_abi_cxx11_(&local_e8,(bloaty *)local_b8,info_00);
      disassembly._M_str = local_e8._M_dataplus._M_p;
      disassembly._M_len = local_e8._M_string_length;
      RollupOutput::SetDisassembly((RollupOutput *)local_110._32_8_,disassembly);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        (ulong)(local_e8.field_2._M_allocated_capacity + 1));
      }
      if ((InputFileFactory *)local_110._0_8_ != (InputFileFactory *)0x0) {
        (*(*(_func_int ***)local_110._0_8_)[1])();
      }
      if ((char)iVar4 != '\0') {
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
        ::~_Rb_tree(&local_78);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                     *)(local_b8 + 0x10));
        return;
      }
    }
    pIVar5 = pIVar5 + 1;
  } while( true );
}

Assistant:

void Bloaty::DisassembleFunction(string_view function, const Options& options,
                                 RollupOutput* output) {
  DisassemblyInfo info;
  for (const auto& file_info : input_files_) {
    auto file = GetObjectFile(file_info.filename_);
    if (file->GetDisassemblyInfo(function, EffectiveSymbolSource(options),
                                 &info)) {
      output->SetDisassembly(::bloaty::DisassembleFunction(info));
      return;
    }
  }

  THROWF("Couldn't find function $0 to disassemble", function);
}